

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImGuiColorMod>::push_back(ImVector<ImGuiColorMod> *this,ImGuiColorMod *v)

{
  ImGuiColorMod *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int new_capacity;
  
  iVar6 = this->Size;
  if (iVar6 == this->Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    new_capacity = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      new_capacity = iVar5;
    }
    reserve(this,new_capacity);
    iVar6 = this->Size;
  }
  pIVar1 = this->Data;
  pIVar1[iVar6].BackupValue.w = (v->BackupValue).w;
  fVar2 = (v->BackupValue).x;
  fVar3 = (v->BackupValue).y;
  fVar4 = (v->BackupValue).z;
  pIVar1 = pIVar1 + iVar6;
  pIVar1->Col = v->Col;
  (pIVar1->BackupValue).x = fVar2;
  (pIVar1->BackupValue).y = fVar3;
  (pIVar1->BackupValue).z = fVar4;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }